

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O0

bool __thiscall gl4cts::GetTextureSubImage::Errors::testBoundsError(Errors *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  char *local_358;
  MessageBuilder local_350;
  uint local_1cc;
  char *pcStack_1c8;
  GLint is_proper_error_compressed;
  MessageBuilder local_1b0;
  uint local_30;
  int local_2c;
  GLint is_proper_error;
  GLint error_value;
  Functions *gl;
  Errors *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _is_proper_error = CONCAT44(extraout_var,iVar1);
  (*this->m_gl_GetTextureSubImage)
            (this->m_texture_2D,0,2,2,0,4,4,1,0x1908,0x1401,0x10,this->m_destination_buffer);
  local_2c = (**(code **)(_is_proper_error + 0x800))();
  local_30 = (uint)(local_2c == 0x501);
  if (local_30 == 0) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1b0,
                        (char (*) [316])
                        "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if xoffset + width is greater than the texture\'s width, yoffset + height is greater than the texture\'s height, or zoffset + depth is greater than the texture\'s depth. (OpenGL 4.5 Core Specification chapter 8.11.4). However, the error value "
                       );
    pcStack_1c8 = glu::getErrorName(local_2c);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&stack0xfffffffffffffe38);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [16])0x29dd1c0);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  (*this->m_gl_GetCompressedTextureSubImage)
            (this->m_texture_2D_compressed,0,4,4,0,8,8,1,0x10,this->m_destination_buffer);
  local_2c = (**(code **)(_is_proper_error + 0x800))();
  local_1cc = (uint)(local_2c == 0x501);
  if (local_1cc == 0) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_350,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_350,
                        (char (*) [326])
                        "GL_INVALID_VALUE error is expected to be generated by glGetCompressedTextureSubImage if xoffset + width is greater than the texture\'s width, yoffset + height is greater than the texture\'s height, or zoffset + depth is greater than the texture\'s depth. (OpenGL 4.5 Core Specification chapter 8.11.4). However, the error value "
                       );
    local_358 = glu::getErrorName(local_2c);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_358);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [16])0x29dd1c0);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_350);
  }
  if ((local_30 == 0) || (local_1cc == 0)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool gl4cts::GetTextureSubImage::Errors::testBoundsError()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Uncompresse texture test. */
	m_gl_GetTextureSubImage(m_texture_2D, 0, s_texture_data_width, s_texture_data_height, 0, s_texture_data_width * 2,
							s_texture_data_height * 2, 1, GL_RGBA, GL_UNSIGNED_BYTE, s_destination_buffer_size,
							m_destination_buffer);

	glw::GLint error_value	 = gl.getError();
	glw::GLint is_proper_error = (GL_INVALID_VALUE == error_value);

	if (!is_proper_error)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if xoffset + width is"
			   " greater than the texture's width, yoffset + height is greater than"
			   " the texture's height, or zoffset + depth is greater than the"
			   " texture's depth. (OpenGL 4.5 Core Specification chapter 8.11.4)."
			   " However, the error value "
			<< glu::getErrorName(error_value) << " was generated." << tcu::TestLog::EndMessage;
	}

	/* Compresse texture test. */
	m_gl_GetCompressedTextureSubImage(m_texture_2D_compressed, 0, s_texture_data_compressed_width,
									  s_texture_data_compressed_height, 0, s_texture_data_compressed_width * 2,
									  s_texture_data_compressed_height * 2, 1, s_destination_buffer_size,
									  m_destination_buffer);

	error_value = gl.getError();

	glw::GLint is_proper_error_compressed = (GL_INVALID_VALUE == error_value);

	if (!is_proper_error_compressed)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "GL_INVALID_VALUE error is expected to be generated by glGetCompressedTextureSubImage if "
							  "xoffset + width is"
							  " greater than the texture's width, yoffset + height is greater than"
							  " the texture's height, or zoffset + depth is greater than the"
							  " texture's depth. (OpenGL 4.5 Core Specification chapter 8.11.4)."
							  " However, the error value "
						   << glu::getErrorName(error_value) << " was generated." << tcu::TestLog::EndMessage;
	}

	if (is_proper_error && is_proper_error_compressed)
	{
		return true;
	}

	return false;
}